

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O3

Gia_Man_t * Acec_DetectAdditional(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vRootXorSet;
  Gia_Man_t *pGVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  timespec ts;
  timespec local_28;
  
  clock_gettime(3,&local_28);
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  vRootXorSet = Acec_CollectXorTops(p);
  if (vRootXorSet == (Vec_Int_t *)0x0) {
    pGVar2 = Gia_ManDup(p);
    piVar5 = (int *)&DAT_00000004;
  }
  else {
    Acec_DetectComputeSupports(p,vRootXorSet);
    pGVar2 = Acec_DetectXorBuildNew(p,vRootXorSet);
    if (vRootXorSet->pArray != (int *)0x0) {
      free(vRootXorSet->pArray);
    }
    free(vRootXorSet);
    piVar5 = &vRootXorSet->nSize;
  }
  iVar1 = *piVar5;
  iVar4 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  printf("Detected %d top XORs.  ",(ulong)(uint)(iVar4 >> 2));
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar6 + lVar3) / 1000000.0);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acec_DetectAdditional( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vRootXorSet;
//    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );

    //Ree_ManPrintAdders( vAdds, 1 );
//    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vRootXorSet = Acec_CollectXorTops( p );
    if ( vRootXorSet )
    {
        Acec_DetectComputeSupports( p, vRootXorSet );

        pNew = Acec_DetectXorBuildNew( p, vRootXorSet );
        Vec_IntFree( vRootXorSet );
    }
    else
        pNew = Gia_ManDup( p );

    printf( "Detected %d top XORs.  ", Vec_IntSize(vRootXorSet)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

//    Vec_IntFree( vXors );
//    Vec_IntFree( vAdds );
    return pNew;
}